

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_bilinear.h
# Opt level: O2

void ncnn::linear_coeffs(int w,int outw,int *xofs,float *alpha,int align_corner)

{
  double dVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  double dVar6;
  float fVar7;
  undefined1 auVar8 [16];
  
  if (align_corner == 0) {
    dVar6 = (double)w / (double)outw;
  }
  else {
    dVar6 = (double)(w + -1) / (double)(outw + -1);
  }
  uVar3 = (ulong)(uint)outw;
  if (outw < 1) {
    uVar3 = 0;
  }
  for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    dVar1 = ((double)(int)uVar4 + 0.5) * dVar6 + -0.5;
    if (align_corner != 0) {
      dVar1 = dVar6 * (double)(int)uVar4;
    }
    auVar8._0_4_ = (float)dVar1;
    auVar8._4_4_ = (int)((ulong)dVar1 >> 0x20);
    auVar8._8_8_ = 0;
    auVar2 = vroundss_avx(auVar8,auVar8,9);
    iVar5 = (int)auVar2._0_4_;
    fVar7 = 0.0;
    if (-1 < iVar5) {
      fVar7 = auVar8._0_4_ - auVar2._0_4_;
    }
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    if (w + -1 <= iVar5) {
      iVar5 = w + -2;
      fVar7 = 1.0;
    }
    xofs[uVar4] = iVar5;
    alpha[uVar4 * 2] = 1.0 - fVar7;
    alpha[uVar4 * 2 + 1] = fVar7;
  }
  return;
}

Assistant:

static void linear_coeffs(int w, int outw, int* xofs, float* alpha, int align_corner)
{
    double scale = (double)w / outw;
    if (align_corner)
    {
        scale = (double)(w - 1) / (outw - 1);
    }

    for (int dx = 0; dx < outw; dx++)
    {
        float fx = (float)((dx + 0.5) * scale - 0.5);
        if (align_corner)
        {
            fx = (float)(dx * scale);
        }

        int sx = (int)floorf(fx);
        fx -= sx;

        if (sx < 0)
        {
            sx = 0;
            fx = 0.f;
        }
        if (sx >= w - 1)
        {
            sx = w - 2;
            fx = 1.f;
        }

        xofs[dx] = sx;

        alpha[dx * 2] = 1.f - fx;
        alpha[dx * 2 + 1] = fx;
    }
}